

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# os.c
# Opt level: O3

sx_pinfo sx_os_exec(char **argv)

{
  __pid_t _Var1;
  ulong uVar2;
  sx_pinfo sVar3;
  
  _Var1 = fork();
  if (_Var1 == 0) {
    execvp(*argv,argv + 1);
    uVar2 = 0;
  }
  else {
    uVar2 = (ulong)_Var1;
  }
  sVar3.win_thread_handle = (void *)0x0;
  sVar3.field_0 = (anon_union_8_2_0914d8fa_for_sx_pinfo_0)uVar2;
  return sVar3;
}

Assistant:

sx_pinfo sx_os_exec(const char* const* argv)
{
#if SX_PLATFORM_LINUX || SX_PLATFORM_HURD
    pid_t pid = fork();

    if (0 == pid) {
        int result = execvp(argv[0], (char* const*)(&argv[1]));
        sx_unused(result);
        return (sx_pinfo){ 0 };
    }

    return (sx_pinfo){ .linux_pid = (uintptr_t)pid };
#elif SX_PLATFORM_WINDOWS
    STARTUPINFOA si;
    sx_memset(&si, 0, sizeof(STARTUPINFOA));
    si.cb = sizeof(STARTUPINFOA);

    PROCESS_INFORMATION pi;
    sx_memset(&pi, 0, sizeof(PROCESS_INFORMATION));

    int total = 0;
    for (int ii = 0; NULL != argv[ii]; ++ii) {
        total += sx_strlen(argv[ii]) + 1;
    }

    sx_assert(total <= 32768);
    char* temp = (char*)alloca(total);
    sx_assert(temp);
    int len = 0;
    for (int ii = 0; NULL != argv[ii]; ++ii) {
        len += sx_snprintf(&temp[len], sx_max(0, total - len), "%s ", argv[ii]);
    }

    sx_pinfo pinfo;

    bool ok = !!CreateProcessA(argv[0], temp, NULL, NULL, false, 0, NULL, NULL, &si, &pi);
    if (ok) {
        pinfo.win_process_handle = pi.hProcess;
        pinfo.win_thread_handle = pi.hThread;
    } else {
        pinfo.win_process_handle = NULL;
        pinfo.win_thread_handle = NULL;
    }

    return pinfo;
#else
    sx_unused(argv);
    sx_assertf(0, "not implemented");
    return (sx_pinfo){ {0}, 0 };
#endif    // SX_PLATFORM_
}